

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

ItemList *
Lib::UniquePersistentIterator<Kernel::FirstOrderSubtermIt>::getUniqueItemList
          (FirstOrderSubtermIt *inn,size_t *sizeRef)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  List<Kernel::Term_*> *l;
  size_t sVar3;
  Recycled<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  iset;
  Recycled<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_30;
  
  Recycled<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_30);
  sVar3 = 0;
  l = (List<Kernel::Term_*> *)0x0;
  do {
    *sizeRef = sVar3;
    do {
      iVar2 = (*(inn->super_IteratorCore<Kernel::Term_*>)._vptr_IteratorCore[2])(inn);
      if ((char)iVar2 == '\0') {
        Recycled<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&local_30);
        return l;
      }
      iVar2 = (*(inn->super_IteratorCore<Kernel::Term_*>)._vptr_IteratorCore[3])(inn);
      bVar1 = DHMap<Kernel::Term_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                        ((DHMap<Kernel::Term_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                          *)local_30._self._M_t.
                            super___uniq_ptr_impl<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                            .
                            super__Head_base<0UL,_Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                            ._M_head_impl,(Term *)CONCAT44(extraout_var,iVar2));
    } while (!bVar1);
    l = List<Kernel::Term_*>::cons((Term *)CONCAT44(extraout_var,iVar2),l);
    sVar3 = *sizeRef + 1;
  } while( true );
}

Assistant:

static ItemList* getUniqueItemList(Inner& inn, size_t& sizeRef)
  {
    ItemList* res=0;
    Recycled<ItemSet> iset;

    sizeRef=0;
    while(inn.hasNext()) {
      T el=inn.next();
      if(iset->insert(el)) {
	ItemList::push(el, res);
	sizeRef++;
      }
    }

    return res;
  }